

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::SemanticAnalyzerRun
          (SemanticAnalyzerRun *this,ostream *out,shared_ptr<const_Readable> *reader)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  long lVar3;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined8 local_3a0;
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  undefined8 local_350;
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined8 local_2b0;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined8 local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined8 local_210;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined8 local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined8 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined8 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58;
  long *local_50 [2];
  long local_40 [2];
  undefined8 local_30;
  undefined1 local_28 [5];
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  (this->super_AstWalker)._vptr_AstWalker = (_func_int **)&PTR__SemanticAnalyzerRun_00130198;
  this->out = out;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"add","");
  local_3c8 = 2;
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"subtract","");
  local_3a0 = 2;
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"multiply","");
  local_378 = 2;
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"divide","");
  local_350 = 2;
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"equal","");
  local_328 = 2;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"notEqual","");
  local_300 = 2;
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"not","");
  local_2d8 = 1;
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"and","");
  local_2b0 = 2;
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"or","");
  local_288 = 2;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"greater","");
  local_260 = 2;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"less","");
  local_238 = 2;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"greaterOrEqual","");
  local_210 = 2;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"lessOrEqual","");
  local_1e8 = 2;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"get","");
  local_1c0 = 2;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"set","");
  local_198 = 3;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"read","");
  local_170 = 0;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"print","");
  local_148 = 1;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"env","");
  local_120 = 1;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"type","");
  local_f8 = 1;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"int","");
  local_d0 = 1;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"float","");
  local_a8 = 1;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"length","");
  local_80 = 1;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"charAt","");
  local_58 = 2;
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"append","");
  local_30 = 2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,unsigned_long>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->builtInFunctionArgumentCounts,local_3e8,local_28,0,&local_23,&local_22,
             &local_21);
  lVar3 = -0x3c0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  this->error = false;
  this->functionDept = 0;
  this->inLoop = false;
  (this->inLoopState)._M_h._M_buckets = &(this->inLoopState)._M_h._M_single_bucket;
  (this->inLoopState)._M_h._M_bucket_count = 1;
  (this->inLoopState)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inLoopState)._M_h._M_element_count = 0;
  (this->inLoopState)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inLoopState)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inLoopState)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130348;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 5);
  p_Var1[2]._M_use_count = 1;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  *(undefined4 *)&p_Var1[4]._vptr__Sp_counted_base = 0x3f800000;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var1[5]._M_use_count = 1;
  (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

explicit SemanticAnalyzerRun(std::ostream & out, std::shared_ptr<const Readable> reader) noexcept
  : out{out}
  , reader{std::move(reader)}
  , builtInFunctionArgumentCounts{{
    {"add", 2},
    {"subtract", 2},
    {"multiply", 2},
    {"divide", 2},
    {"equal", 2},
    {"notEqual", 2},
    {"not", 1},
    {"and", 2},
    {"or", 2},
    {"greater", 2},
    {"less", 2},
    {"greaterOrEqual", 2},
    {"lessOrEqual", 2},
    {"get", 2},
    {"set", 3},
    {"read", 0},
    {"print", 1},
    {"env", 1},
    {"type", 1},
    {"int", 1},
    {"float", 1},
    {"length", 1},
    {"charAt", 2},
    {"append", 2}
  }}
  , error{false}
  , functionDept{0}
  , inLoop{false}
  , currentScope{std::make_shared<Scope>()}
  {}